

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::StateSaver::Restore(StateSaver *this)

{
  ostream *poVar1;
  LogMessage local_1b8;
  StateSaver *local_28;
  State *s;
  MutexLock l;
  StateSaver *this_local;
  
  if ((this->is_special_ & 1U) == 0) {
    l.mu_ = (Mutex *)this;
    MutexLock::MutexLock((MutexLock *)&s,&this->dfa_->mutex_);
    local_28 = (StateSaver *)CachedState(this->dfa_,this->inst_,this->ninst_,this->flag_);
    if (local_28 == (StateSaver *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x4d9
                );
      poVar1 = LogMessage::stream(&local_1b8);
      std::operator<<(poVar1,"StateSaver failed to restore state.");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    }
    this_local = local_28;
    MutexLock::~MutexLock((MutexLock *)&s);
  }
  else {
    this_local = (StateSaver *)this->special_;
  }
  return (State *)this_local;
}

Assistant:

DFA::State* DFA::StateSaver::Restore() {
  if (is_special_)
    return special_;
  MutexLock l(&dfa_->mutex_);
  State* s = dfa_->CachedState(inst_, ninst_, flag_);
  if (s == NULL)
    LOG(DFATAL) << "StateSaver failed to restore state.";
  return s;
}